

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.cpp
# Opt level: O1

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::GetCurrentNetwork
          (PersistentStorageJson *this,NetworkId *aNwkId)

{
  value_t vVar1;
  json_value jVar2;
  iterator iVar3;
  reference pvVar4;
  NetworkId ret;
  NetworkId local_2c;
  undefined1 local_28 [8];
  json_value local_20;
  
  if (((this->mCache).m_type == object) &&
     (iVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
              ::find(&((this->mCache).m_value.object)->_M_t,(key_type *)JSON_CURR_NWK_abi_cxx11_),
     (_Rb_tree_header *)iVar3._M_node !=
     &(((this->mCache).m_value.object)->_M_t)._M_impl.super__Rb_tree_header)) {
    pvVar4 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[](&this->mCache,(key_type *)JSON_CURR_NWK_abi_cxx11_);
    NetworkId::NetworkId(&local_2c);
    from_json(pvVar4,&local_2c);
    aNwkId->mId = (uint)local_2c;
    return kSuccess;
  }
  NetworkId::NetworkId(&local_2c);
  aNwkId->mId = (uint)local_2c;
  local_28[0] = null;
  local_20.object = (object_t *)0x0;
  to_json((json *)local_28,aNwkId);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((json *)local_28);
  pvVar4 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::operator[](&this->mCache,(key_type *)JSON_CURR_NWK_abi_cxx11_);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_28);
  vVar1 = pvVar4->m_type;
  pvVar4->m_type = local_28[0];
  jVar2 = pvVar4->m_value;
  pvVar4->m_value = local_20;
  local_28[0] = vVar1;
  local_20 = jVar2;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant(pvVar4);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_28);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_28 + 8),local_28[0]);
  return kSuccess;
}

Assistant:

PersistentStorage::Status PersistentStorageJson::GetCurrentNetwork(NetworkId &aNwkId)
{
    if (!mCache.contains(JSON_CURR_NWK))
    {
        aNwkId                = NetworkId{};
        mCache[JSON_CURR_NWK] = aNwkId;
    }
    else
    {
        aNwkId = mCache[JSON_CURR_NWK];
    }
    return PersistentStorage::Status::kSuccess;
}